

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O3

void __thiscall wallet::MetaPage::Unserialize<AutoFile>(MetaPage *this,AutoFile *s)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  BTreeFlags BVar19;
  int iVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  uint uVar40;
  runtime_error *this_00;
  size_t in_RCX;
  size_t __nbytes;
  long in_FS_OFFSET;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint32_t obj;
  BTreeFlags local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->lsn_file = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->lsn_offset = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->page_num = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->magic = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->version = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->pagesize = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->encrypt_algo = (undefined1)local_24;
  this->other_endian = this->magic == 0x62310500;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->type = (undefined1)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->metaflags = (undefined1)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x1,in_RCX);
  this->unused1 = (undefined1)local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->free_list = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->last_page = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->partitions = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->key_count = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  this->record_count = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,in_RCX);
  BVar19 = local_24 >> 0x18 | (local_24 & 0xff0000) >> 8 | (local_24 & 0xff00) << 8 |
           local_24 << 0x18;
  if (this->other_endian == false) {
    BVar19 = local_24;
  }
  __nbytes = (size_t)BVar19;
  this->flags = BVar19;
  iVar20 = (int)this;
  AutoFile::read(s,iVar20 + 0x34,(void *)0x14,__nbytes);
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->unused2 = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->minkey = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->re_len = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->re_pad = local_24;
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->root = local_24;
  AutoFile::read(s,iVar20 + 0x5c,(void *)0x170,__nbytes);
  AutoFile::read(s,(int)&local_24,(void *)0x4,__nbytes);
  this->crypto_magic = local_24;
  AutoFile::read(s,iVar20 + 0x1d0,(void *)0xc,__nbytes);
  AutoFile::read(s,iVar20 + 0x1dc,(void *)0x14,__nbytes);
  AutoFile::read(s,iVar20 + 0x1f0,(void *)0x10,__nbytes);
  uVar40 = this->page_num;
  if (this->other_endian == true) {
    uVar1 = this->lsn_file;
    uVar2 = this->lsn_offset;
    this->lsn_file = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
    this->lsn_offset =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar40 = uVar40 >> 0x18 | (uVar40 & 0xff0000) >> 8 | (uVar40 & 0xff00) << 8 | uVar40 << 0x18;
    this->page_num = uVar40;
    uVar1 = this->magic;
    this->magic = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = this->version;
    this->version = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = this->pagesize;
    this->pagesize = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18
    ;
    auVar41._0_4_ = this->free_list;
    auVar41._4_4_ = this->last_page;
    auVar41._8_4_ = this->partitions;
    auVar41._12_4_ = this->key_count;
    auVar43[1] = 0;
    auVar43[0] = (byte)auVar41._8_4_;
    auVar43[2] = (char)((uint)auVar41._8_4_ >> 8);
    auVar43[3] = 0;
    auVar43[4] = (char)((uint)auVar41._8_4_ >> 0x10);
    auVar43[5] = 0;
    auVar43[6] = (char)((uint)auVar41._8_4_ >> 0x18);
    auVar43[7] = 0;
    auVar43[8] = (char)auVar41._12_4_;
    auVar43[9] = 0;
    auVar43[10] = (char)((uint)auVar41._12_4_ >> 8);
    auVar43[0xb] = 0;
    auVar43[0xc] = (char)((uint)auVar41._12_4_ >> 0x10);
    auVar43[0xd] = 0;
    auVar43[0xe] = (char)((uint)auVar41._12_4_ >> 0x18);
    auVar43[0xf] = 0;
    auVar44 = pshuflw(auVar43,auVar43,0x1b);
    auVar44 = pshufhw(auVar44,auVar44,0x1b);
    auVar22[0xd] = 0;
    auVar22._0_13_ = auVar41._0_13_;
    auVar22[0xe] = (char)((uint)auVar41._4_4_ >> 0x18);
    auVar24[0xc] = (char)((uint)auVar41._4_4_ >> 0x10);
    auVar24._0_12_ = auVar41._0_12_;
    auVar24._13_2_ = auVar22._13_2_;
    auVar26[0xb] = 0;
    auVar26._0_11_ = auVar41._0_11_;
    auVar26._12_3_ = auVar24._12_3_;
    auVar28[10] = (char)((uint)auVar41._4_4_ >> 8);
    auVar28._0_10_ = auVar41._0_10_;
    auVar28._11_4_ = auVar26._11_4_;
    auVar30[9] = 0;
    auVar30._0_9_ = auVar41._0_9_;
    auVar30._10_5_ = auVar28._10_5_;
    auVar32[8] = (char)auVar41._4_4_;
    auVar32._0_8_ = auVar41._0_8_;
    auVar32._9_6_ = auVar30._9_6_;
    auVar34._7_8_ = 0;
    auVar34._0_7_ = auVar32._8_7_;
    auVar36._1_8_ = SUB158(auVar34 << 0x40,7);
    auVar36[0] = (char)((uint)auVar41._0_4_ >> 0x18);
    auVar36._9_6_ = 0;
    auVar37._1_10_ = SUB1510(auVar36 << 0x30,5);
    auVar37[0] = (char)((uint)auVar41._0_4_ >> 0x10);
    auVar37._11_4_ = 0;
    auVar46._3_12_ = SUB1512(auVar37 << 0x20,3);
    auVar46[2] = (char)((uint)auVar41._0_4_ >> 8);
    auVar46[0] = (byte)auVar41._0_4_;
    auVar46[1] = 0;
    auVar46[0xf] = 0;
    auVar41 = pshuflw(auVar46,auVar46,0x1b);
    auVar41 = pshufhw(auVar41,auVar41,0x1b);
    sVar3 = auVar41._0_2_;
    sVar4 = auVar41._2_2_;
    sVar5 = auVar41._4_2_;
    sVar6 = auVar41._6_2_;
    sVar7 = auVar41._8_2_;
    sVar8 = auVar41._10_2_;
    sVar9 = auVar41._12_2_;
    sVar10 = auVar41._14_2_;
    sVar11 = auVar44._0_2_;
    sVar12 = auVar44._2_2_;
    sVar13 = auVar44._4_2_;
    sVar14 = auVar44._6_2_;
    sVar15 = auVar44._8_2_;
    sVar16 = auVar44._10_2_;
    sVar17 = auVar44._12_2_;
    sVar18 = auVar44._14_2_;
    *(char *)&this->free_list = (0 < sVar3) * (sVar3 < 0x100) * auVar41[0] - (0xff < sVar3);
    *(char *)((long)&this->free_list + 1) =
         (0 < sVar4) * (sVar4 < 0x100) * auVar41[2] - (0xff < sVar4);
    *(char *)((long)&this->free_list + 2) =
         (0 < sVar5) * (sVar5 < 0x100) * auVar41[4] - (0xff < sVar5);
    *(char *)((long)&this->free_list + 3) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar41[6] - (0xff < sVar6);
    *(char *)&this->last_page = (0 < sVar7) * (sVar7 < 0x100) * auVar41[8] - (0xff < sVar7);
    *(char *)((long)&this->last_page + 1) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar41[10] - (0xff < sVar8);
    *(char *)((long)&this->last_page + 2) =
         (0 < sVar9) * (sVar9 < 0x100) * auVar41[0xc] - (0xff < sVar9);
    *(char *)((long)&this->last_page + 3) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar41[0xe] - (0xff < sVar10);
    *(char *)&this->partitions = (0 < sVar11) * (sVar11 < 0x100) * auVar44[0] - (0xff < sVar11);
    *(char *)((long)&this->partitions + 1) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar44[2] - (0xff < sVar12);
    *(char *)((long)&this->partitions + 2) =
         (0 < sVar13) * (sVar13 < 0x100) * auVar44[4] - (0xff < sVar13);
    *(char *)((long)&this->partitions + 3) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar44[6] - (0xff < sVar14);
    *(char *)&this->key_count = (0 < sVar15) * (sVar15 < 0x100) * auVar44[8] - (0xff < sVar15);
    *(char *)((long)&this->key_count + 1) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar44[10] - (0xff < sVar16);
    *(char *)((long)&this->key_count + 2) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar44[0xc] - (0xff < sVar17);
    *(char *)((long)&this->key_count + 3) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar44[0xe] - (0xff < sVar18);
    uVar1 = this->record_count;
    this->record_count =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    auVar44._0_4_ = this->unused2;
    auVar44._4_4_ = this->minkey;
    auVar44._8_4_ = this->re_len;
    auVar44._12_4_ = this->re_pad;
    auVar45[1] = 0;
    auVar45[0] = (byte)auVar44._8_4_;
    auVar45[2] = (char)((uint)auVar44._8_4_ >> 8);
    auVar45[3] = 0;
    auVar45[4] = (char)((uint)auVar44._8_4_ >> 0x10);
    auVar45[5] = 0;
    auVar45[6] = (char)((uint)auVar44._8_4_ >> 0x18);
    auVar45[7] = 0;
    auVar45[8] = (char)auVar44._12_4_;
    auVar45[9] = 0;
    auVar45[10] = (char)((uint)auVar44._12_4_ >> 8);
    auVar45[0xb] = 0;
    auVar45[0xc] = (char)((uint)auVar44._12_4_ >> 0x10);
    auVar45[0xd] = 0;
    auVar45[0xe] = (char)((uint)auVar44._12_4_ >> 0x18);
    auVar45[0xf] = 0;
    auVar41 = pshuflw(auVar45,auVar45,0x1b);
    auVar46 = pshufhw(auVar41,auVar41,0x1b);
    auVar21[0xd] = 0;
    auVar21._0_13_ = auVar44._0_13_;
    auVar21[0xe] = (char)((uint)auVar44._4_4_ >> 0x18);
    auVar23[0xc] = (char)((uint)auVar44._4_4_ >> 0x10);
    auVar23._0_12_ = auVar44._0_12_;
    auVar23._13_2_ = auVar21._13_2_;
    auVar25[0xb] = 0;
    auVar25._0_11_ = auVar44._0_11_;
    auVar25._12_3_ = auVar23._12_3_;
    auVar27[10] = (char)((uint)auVar44._4_4_ >> 8);
    auVar27._0_10_ = auVar44._0_10_;
    auVar27._11_4_ = auVar25._11_4_;
    auVar29[9] = 0;
    auVar29._0_9_ = auVar44._0_9_;
    auVar29._10_5_ = auVar27._10_5_;
    auVar31[8] = (char)auVar44._4_4_;
    auVar31._0_8_ = auVar44._0_8_;
    auVar31._9_6_ = auVar29._9_6_;
    auVar35._7_8_ = 0;
    auVar35._0_7_ = auVar31._8_7_;
    auVar38._1_8_ = SUB158(auVar35 << 0x40,7);
    auVar38[0] = (char)((uint)auVar44._0_4_ >> 0x18);
    auVar38._9_6_ = 0;
    auVar39._1_10_ = SUB1510(auVar38 << 0x30,5);
    auVar39[0] = (char)((uint)auVar44._0_4_ >> 0x10);
    auVar39._11_4_ = 0;
    auVar33[2] = (char)((uint)auVar44._0_4_ >> 8);
    auVar33._0_2_ = (ushort)auVar44._0_4_;
    auVar33._3_12_ = SUB1512(auVar39 << 0x20,3);
    auVar42._0_2_ = (ushort)auVar44._0_4_ & 0xff;
    auVar42._2_13_ = auVar33._2_13_;
    auVar42[0xf] = 0;
    auVar41 = pshuflw(auVar42,auVar42,0x1b);
    auVar41 = pshufhw(auVar41,auVar41,0x1b);
    sVar3 = auVar41._0_2_;
    sVar4 = auVar41._2_2_;
    sVar5 = auVar41._4_2_;
    sVar6 = auVar41._6_2_;
    sVar7 = auVar41._8_2_;
    sVar8 = auVar41._10_2_;
    sVar9 = auVar41._12_2_;
    sVar10 = auVar41._14_2_;
    sVar11 = auVar46._0_2_;
    sVar12 = auVar46._2_2_;
    sVar13 = auVar46._4_2_;
    sVar14 = auVar46._6_2_;
    sVar15 = auVar46._8_2_;
    sVar16 = auVar46._10_2_;
    sVar17 = auVar46._12_2_;
    sVar18 = auVar46._14_2_;
    *(char *)&this->unused2 = (0 < sVar3) * (sVar3 < 0x100) * auVar41[0] - (0xff < sVar3);
    *(char *)((long)&this->unused2 + 1) =
         (0 < sVar4) * (sVar4 < 0x100) * auVar41[2] - (0xff < sVar4);
    *(char *)((long)&this->unused2 + 2) =
         (0 < sVar5) * (sVar5 < 0x100) * auVar41[4] - (0xff < sVar5);
    *(char *)((long)&this->unused2 + 3) =
         (0 < sVar6) * (sVar6 < 0x100) * auVar41[6] - (0xff < sVar6);
    *(char *)&this->minkey = (0 < sVar7) * (sVar7 < 0x100) * auVar41[8] - (0xff < sVar7);
    *(char *)((long)&this->minkey + 1) =
         (0 < sVar8) * (sVar8 < 0x100) * auVar41[10] - (0xff < sVar8);
    *(char *)((long)&this->minkey + 2) =
         (0 < sVar9) * (sVar9 < 0x100) * auVar41[0xc] - (0xff < sVar9);
    *(char *)((long)&this->minkey + 3) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar41[0xe] - (0xff < sVar10);
    *(char *)&this->re_len = (0 < sVar11) * (sVar11 < 0x100) * auVar46[0] - (0xff < sVar11);
    *(char *)((long)&this->re_len + 1) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar46[2] - (0xff < sVar12);
    *(char *)((long)&this->re_len + 2) =
         (0 < sVar13) * (sVar13 < 0x100) * auVar46[4] - (0xff < sVar13);
    *(char *)((long)&this->re_len + 3) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar46[6] - (0xff < sVar14);
    *(char *)&this->re_pad = (0 < sVar15) * (sVar15 < 0x100) * auVar46[8] - (0xff < sVar15);
    *(char *)((long)&this->re_pad + 1) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar46[10] - (0xff < sVar16);
    *(char *)((long)&this->re_pad + 2) =
         (0 < sVar17) * (sVar17 < 0x100) * auVar46[0xc] - (0xff < sVar17);
    *(char *)((long)&this->re_pad + 3) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar46[0xe] - (0xff < sVar18);
    uVar1 = this->root;
    this->root = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = this->crypto_magic;
    this->crypto_magic =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  if (uVar40 == this->expected_page_num) {
    if (this->magic == 0x53162) {
      if (this->version == 9) {
        uVar40 = this->pagesize;
        if (uVar40 - 0x200 < 0xfe01) {
          uVar40 = uVar40 - (uVar40 >> 1 & 0x55555555);
          uVar40 = (uVar40 >> 2 & 0x33333333) + (uVar40 & 0x33333333);
          if (((uVar40 >> 4) + uVar40 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
            if (this->type == BTREE_META) {
              if (this->flags == SUBDB) {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
                  return;
                }
                goto LAB_00c7bc57;
              }
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Unexpected database flags, should only be 0x20 (subdatabases)");
            }
            else {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error
                        (this_00,"Unexpected page type, should be 9 (BTree Metadata)");
            }
            goto LAB_00c7bbec;
          }
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Bad page size");
      }
      else {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unsupported BDB data file version number");
      }
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Not a BDB file");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Meta page number mismatch");
  }
LAB_00c7bbec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00c7bc57:
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        s >> lsn_file;
        s >> lsn_offset;
        s >> page_num;
        s >> magic;
        s >> version;
        s >> pagesize;
        s >> encrypt_algo;

        other_endian = magic == BTREE_MAGIC_OE;

        uint8_t uint8_type;
        s >> uint8_type;
        type = static_cast<PageType>(uint8_type);

        s >> metaflags;
        s >> unused1;
        s >> free_list;
        s >> last_page;
        s >> partitions;
        s >> key_count;
        s >> record_count;

        uint32_t uint32_flags;
        s >> uint32_flags;
        if (other_endian) {
            uint32_flags = internal_bswap_32(uint32_flags);
        }
        flags = static_cast<BTreeFlags>(uint32_flags);

        s >> uid;
        s >> unused2;
        s >> minkey;
        s >> re_len;
        s >> re_pad;
        s >> root;
        s >> unused3;
        s >> crypto_magic;
        s >> trash;
        s >> iv;
        s >> chksum;

        if (other_endian) {
            lsn_file = internal_bswap_32(lsn_file);
            lsn_offset = internal_bswap_32(lsn_offset);
            page_num = internal_bswap_32(page_num);
            magic = internal_bswap_32(magic);
            version = internal_bswap_32(version);
            pagesize = internal_bswap_32(pagesize);
            free_list = internal_bswap_32(free_list);
            last_page = internal_bswap_32(last_page);
            partitions = internal_bswap_32(partitions);
            key_count = internal_bswap_32(key_count);
            record_count = internal_bswap_32(record_count);
            unused2 = internal_bswap_32(unused2);
            minkey = internal_bswap_32(minkey);
            re_len = internal_bswap_32(re_len);
            re_pad = internal_bswap_32(re_pad);
            root = internal_bswap_32(root);
            crypto_magic = internal_bswap_32(crypto_magic);
        }

        // Page number must match
        if (page_num != expected_page_num) {
            throw std::runtime_error("Meta page number mismatch");
        }

        // Check magic
        if (magic != BTREE_MAGIC) {
            throw std::runtime_error("Not a BDB file");
        }

        // Only version 9 is supported
        if (version != 9) {
            throw std::runtime_error("Unsupported BDB data file version number");
        }

        // Page size must be 512 <= pagesize <= 64k, and be a power of 2
        if (pagesize < 512 || pagesize > 65536 || (pagesize & (pagesize - 1)) != 0) {
            throw std::runtime_error("Bad page size");
        }

        // Page type must be the btree type
        if (type != PageType::BTREE_META) {
            throw std::runtime_error("Unexpected page type, should be 9 (BTree Metadata)");
        }

        // Only supported meta-flag is subdatabase
        if (flags != BTreeFlags::SUBDB) {
            throw std::runtime_error("Unexpected database flags, should only be 0x20 (subdatabases)");
        }
    }